

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O3

size_t __thiscall
embree::FastAllocator::Block::getFreeBytes(Block *this,AllocationType atype,bool huge_pages)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar3 = 0;
  do {
    if (atype == ANY_TYPE) {
LAB_00b7b661:
      uVar1 = (this->allocEnd).super___atomic_base<unsigned_long>._M_i;
      uVar2 = (this->cur).super___atomic_base<unsigned_long>._M_i;
      if (uVar2 < uVar1) {
        uVar2 = uVar1;
      }
      uVar1 = (this->reserveEnd).super___atomic_base<unsigned_long>._M_i;
      if (uVar1 <= uVar2) {
        uVar2 = uVar1;
      }
      uVar1 = (this->cur).super___atomic_base<unsigned_long>._M_i;
      uVar4 = (this->reserveEnd).super___atomic_base<unsigned_long>._M_i;
      if (uVar1 < uVar4) {
        uVar4 = uVar1;
      }
      sVar3 = (uVar2 + sVar3) - uVar4;
    }
    else if (this->atype == EMBREE_OS_MALLOC) {
      if ((atype == EMBREE_OS_MALLOC) && (this->huge_pages == huge_pages)) goto LAB_00b7b661;
    }
    else if (this->atype == atype) goto LAB_00b7b661;
    this = this->next;
    if (this == (Block *)0x0) {
      return sVar3;
    }
  } while( true );
}

Assistant:

size_t getFreeBytes(AllocationType atype, bool huge_pages = false) const {
        size_t bytes = 0;
        for (const Block* block = this; block; block = block->next) {
          if (!block->hasType(atype,huge_pages)) continue;
          bytes += block->getBlockFreeBytes();
        }
        return bytes;
      }